

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall PeleLM::post_regrid(PeleLM *this,int lbase,int new_finest)

{
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> this_00;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  int iVar6;
  double *pdVar7;
  long lVar8;
  double *pdVar9;
  bool bVar10;
  double dVar11;
  MFIter mfi;
  Box local_15c;
  long local_140;
  PeleLM *local_138;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_130;
  long local_128;
  long local_120;
  double *local_118;
  Array4<double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  NavierStokesBase::post_regrid(&this->super_NavierStokesBase,lbase,new_finest);
  if (do_set_rho_to_species_sum != 0) {
    if ((0 < *(((this->super_NavierStokesBase).super_AmrLevel.parent)->level_steps).
              super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start) &&
       (lbase < (this->super_NavierStokesBase).super_AmrLevel.level)) {
      local_130._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (((this->super_NavierStokesBase).super_AmrLevel.state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start)->new_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
      local_138 = this;
      amrex::MFIter::MFIter
                (&local_90,
                 (FabArrayBase *)
                 local_130._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,true);
      if (local_90.currentIndex < local_90.endIndex) {
        do {
          amrex::MFIter::tilebox(&local_15c,&local_90);
          this_00._M_t.
          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
          super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
               (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
               (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)local_130;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_d0,
                     (FabArray<amrex::FArrayBox> *)
                     local_130._M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_90,3);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_110,
                     (FabArray<amrex::FArrayBox> *)
                     this_00._M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_90,
                     first_spec);
          local_140 = local_110.jstride;
          if (local_15c.smallend.vect[2] <= local_15c.bigend.vect[2] && clipSpeciesOnRegrid != 0) {
            iVar6 = local_15c.smallend.vect[2];
            do {
              if (local_15c.smallend.vect[1] <= local_15c.bigend.vect[1]) {
                pdVar9 = (double *)
                         ((long)local_110.p +
                         ((long)iVar6 - (long)local_110.begin.z) * local_110.kstride * 8 +
                         ((long)local_15c.smallend.vect[1] - (long)local_110.begin.y) *
                         local_110.jstride * 8 + (long)local_15c.smallend.vect[0] * 8 +
                         (long)local_110.begin.x * -8);
                lVar4 = (long)local_15c.smallend.vect[1];
                do {
                  pdVar7 = pdVar9;
                  lVar8 = (long)local_15c.smallend.vect[0];
                  if (local_15c.smallend.vect[0] <= local_15c.bigend.vect[0]) {
                    do {
                      lVar1 = 0x15;
                      pdVar5 = pdVar7;
                      do {
                        dVar11 = *pdVar5;
                        if (1.79769313486232e+308 <= dVar11) {
                          dVar11 = 1.79769313486232e+308;
                        }
                        if (dVar11 <= 0.0) {
                          dVar11 = 0.0;
                        }
                        *pdVar5 = dVar11;
                        pdVar5 = pdVar5 + local_110.nstride;
                        lVar1 = lVar1 + -1;
                      } while (lVar1 != 0);
                      lVar8 = lVar8 + 1;
                      pdVar7 = pdVar7 + 1;
                    } while (local_15c.bigend.vect[0] + 1 != (int)lVar8);
                  }
                  lVar4 = lVar4 + 1;
                  pdVar9 = pdVar9 + local_110.jstride;
                } while (local_15c.bigend.vect[1] + 1 != (int)lVar4);
              }
              bVar10 = iVar6 != local_15c.bigend.vect[2];
              iVar6 = iVar6 + 1;
            } while (bVar10);
          }
          if (local_15c.smallend.vect[2] <= local_15c.bigend.vect[2]) {
            local_118 = local_d0.p;
            local_120 = local_d0.kstride;
            local_128 = (long)local_d0.begin.z;
            iVar6 = local_15c.smallend.vect[2];
            do {
              if (local_15c.smallend.vect[1] <= local_15c.bigend.vect[1]) {
                pdVar9 = (double *)
                         ((long)local_110.p +
                         ((long)iVar6 - (long)local_110.begin.z) * local_110.kstride * 8 +
                         ((long)local_15c.smallend.vect[1] - (long)local_110.begin.y) *
                         local_110.jstride * 8 + (long)local_15c.smallend.vect[0] * 8 +
                         (long)local_110.begin.x * -8);
                lVar8 = (iVar6 - local_128) * local_d0.kstride;
                lVar4 = (long)local_15c.smallend.vect[1];
                do {
                  if (local_15c.smallend.vect[0] <= local_15c.bigend.vect[0]) {
                    lVar2 = (lVar4 - local_d0.begin.y) * local_d0.jstride;
                    lVar1 = (long)local_15c.smallend.vect[0];
                    pdVar7 = pdVar9;
                    do {
                      local_d0.p[lVar8 + lVar2 + (lVar1 - local_d0.begin.x)] = 0.0;
                      dVar11 = 0.0;
                      lVar3 = 0x15;
                      pdVar5 = pdVar7;
                      do {
                        dVar11 = dVar11 + *pdVar5;
                        local_d0.p[lVar8 + lVar2 + (lVar1 - local_d0.begin.x)] = dVar11;
                        pdVar5 = pdVar5 + local_110.nstride;
                        lVar3 = lVar3 + -1;
                      } while (lVar3 != 0);
                      lVar1 = lVar1 + 1;
                      pdVar7 = pdVar7 + 1;
                    } while (local_15c.bigend.vect[0] + 1 != (int)lVar1);
                  }
                  lVar4 = lVar4 + 1;
                  pdVar9 = pdVar9 + local_110.jstride;
                } while (local_15c.bigend.vect[1] + 1 != (int)lVar4);
              }
              bVar10 = iVar6 != local_15c.bigend.vect[2];
              iVar6 = iVar6 + 1;
            } while (bVar10);
          }
          amrex::MFIter::operator++(&local_90);
        } while (local_90.currentIndex < local_90.endIndex);
      }
      amrex::MFIter::~MFIter(&local_90);
      this = local_138;
    }
    NavierStokesBase::make_rho_curr_time(&this->super_NavierStokesBase);
  }
  return;
}

Assistant:

void
PeleLM::post_regrid (int lbase,
                     int new_finest)
{
   BL_PROFILE("PLM::post_regrid()");
   NavierStokesBase::post_regrid(lbase, new_finest);
   //
   // FIXME: This may be necessary regardless, unless the interpolation
   //        to fine from coarse data preserves rho=sum(rho.Y)
   //
   if (!do_set_rho_to_species_sum) return;

   if (parent->levelSteps(0)>0 && level>lbase) {
      MultiFab& Snew = get_new_data(State_Type);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
      for (MFIter mfi(Snew,TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
         const Box& bx = mfi.tilebox();
         auto const& rho     = Snew.array(mfi,Density);
         auto const& rhoY    = Snew.array(mfi,first_spec);
         if (clipSpeciesOnRegrid) {
            amrex::ParallelFor(bx, [rhoY]
            AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
               fabMinMax( i, j, k, NUM_SPECIES, 0.0, Real_MAX, rhoY);
            });
         }
         amrex::ParallelFor(bx, [rho, rhoY]
         AMREX_GPU_DEVICE (int i, int j, int k) noexcept
         {
            rho(i,j,k) = 0.0;
            for (int n = 0; n < NUM_SPECIES; n++) {
               rho(i,j,k) += rhoY(i,j,k,n);
            }
         });
      }
   }
   make_rho_curr_time();
}